

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_xml.c
# Opt level: O3

LY_ERR lydxml_subtree_r(lyd_xml_ctx *lydctx,lyd_node *parent,lyd_node **first_p,ly_set *parsed)

{
  ushort uVar1;
  char *str;
  ly_ctx *ctx;
  lysc_ext_instance *plVar2;
  lysc_ext *plVar3;
  lyxml_ctx *xmlctx;
  anon_union_8_2_93990481_for_lyxml_ctx_9 *value_len;
  lysc_ext_instance **pplVar4;
  long lVar5;
  ly_set *set;
  LY_ERR LVar6;
  int iVar7;
  LY_ERR LVar8;
  LYXML_PARSER_STATUS LVar9;
  LY_ERR LVar10;
  lyxml_ns *plVar11;
  lys_module *plVar12;
  lysc_node *plVar13;
  void *pvVar14;
  uint32_t *opts;
  lyd_node *plVar15;
  lyxml_ctx *plVar16;
  size_t sVar17;
  lyd_node **first_p_00;
  long lVar18;
  lyd_node *plVar19;
  ly_err_item *plVar20;
  ulong prefix_len;
  uint uVar21;
  char *pcVar22;
  lysc_ext_instance *plVar23;
  lysc_node **pplVar24;
  void *pvVar25;
  ly_ctx *plVar26;
  uint32_t uVar27;
  char cVar28;
  ulong str_len;
  bool bVar29;
  lysc_ext_instance **pplVar30;
  lysc_ext_instance **ext_00;
  lyd_node *node;
  ly_ctx *local_140;
  lysc_node *snode;
  lyd_node *local_130;
  char *local_128;
  lyxml_ctx *local_120;
  char *local_118;
  lyd_meta *meta;
  lysc_ext_instance *ext;
  uint32_t hints;
  ly_set *local_f8;
  size_t local_f0;
  ulong local_e8;
  lyxml_ctx *local_e0;
  lysc_node *local_d8;
  LY_VALUE_FORMAT local_cc;
  anon_union_8_2_93990481_for_lyxml_ctx_9 *local_c8;
  lyd_attr *attr;
  uint local_b8;
  uint local_b4;
  lyd_node *local_b0;
  lyd_node *insert_anchor;
  ly_set *local_a0;
  lyxml_ctx pxmlctx;
  
  meta = (lyd_meta *)0x0;
  attr = (lyd_attr *)0x0;
  snode = (lysc_node *)0x0;
  ext = (lysc_ext_instance *)0x0;
  node = (lyd_node *)0x0;
  insert_anchor = (lyd_node *)0x0;
  local_130 = parent;
  local_b0 = (lyd_node *)first_p;
  if (parent == (lyd_node *)0x0 && first_p == (lyd_node **)0x0) {
    __assert_fail("parent || first_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x3f2,
                  "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                 );
  }
  plVar16 = lydctx->xmlctx;
  local_140 = plVar16->ctx;
  local_b8 = lydctx->parse_opts;
  uVar21 = local_b8 & 0xffbfffff;
  lydctx->parse_opts = uVar21;
  local_a0 = parsed;
  if (plVar16->status != LYXML_ELEMENT) {
    __assert_fail("xmlctx->status == LYXML_ELEMENT",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x3fc,
                  "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                 );
  }
  pcVar22 = (plVar16->field_3).prefix;
  local_f0 = (plVar16->field_4).prefix_len;
  str = (plVar16->field_5).name;
  str_len = (plVar16->field_6).name_len;
  LVar6 = lyxml_ctx_next(plVar16);
  sVar17 = local_f0;
  plVar26 = local_140;
  local_b4 = uVar21;
  if (LVar6 != LY_SUCCESS) goto LAB_001304e3;
  uVar27 = lydctx->int_opts;
  local_128 = str;
  local_120 = plVar16;
  local_118 = pcVar22;
  if (local_f0 != 0 || ((-1 < (char)uVar27 || local_130 != (lyd_node *)0x0) || str_len == 0)) {
LAB_00130580:
    plVar16 = lydctx->xmlctx;
    ctx = plVar16->ctx;
    snode = (lysc_node *)0x0;
    ext = (lysc_ext_instance *)0x0;
    plVar11 = lyxml_ns_get(&plVar16->ns,local_118,sVar17);
    plVar19 = local_130;
    if (plVar11 == (lyxml_ns *)0x0) {
      if ((lydctx->int_opts & 0x10) == 0) {
        lydxml_log_namespace_err(plVar16,local_118,local_f0,(char *)0x0,0);
        plVar26 = local_140;
      }
      else {
        if ((lydctx->parse_opts & 0x20000) == 0) goto LAB_0013089a;
        if (local_f0 == 0) {
          ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,"No default namespace in the context.");
          plVar26 = local_140;
        }
        else {
          ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,"No module with namespace \"%.*s\" in the context."
                  ,local_f0,local_118);
          plVar26 = local_140;
        }
      }
    }
    else {
      uVar27 = (uVar27 & 4) << 2;
      if (local_130 == (lyd_node *)0x0) {
        plVar12 = ly_ctx_get_module_implemented_ns(ctx,plVar11->uri);
        if (plVar12 != (lys_module *)0x0) {
          if (lydctx->ext == (lysc_ext_instance *)0x0) goto LAB_001306d9;
          plVar13 = lysc_ext_find_node(lydctx->ext,plVar12,local_128,str_len,0,uVar27);
          goto LAB_001306fa;
        }
LAB_00130775:
        LVar6 = ly_nested_ext_schema
                          (plVar19,(lysc_node *)0x0,local_118,local_f0,LY_VALUE_XML,
                           &lydctx->xmlctx->ns,local_128,str_len,&snode,&ext);
        if (LVar6 == LY_ENOT) {
          if ((lydctx->parse_opts & 0x20000) == 0) goto LAB_0013089a;
          ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,"No module with namespace \"%s\" in the context.",
                  plVar11->uri);
          plVar26 = local_140;
          goto LAB_00130f54;
        }
      }
      else {
        if (local_130->schema == (lysc_node *)0x0) {
          plVar12 = (lys_module *)&local_130[2].schema;
        }
        else {
          plVar12 = local_130->schema->module;
        }
        plVar12 = ly_ctx_get_module_implemented_ns(plVar12->ctx,plVar11->uri);
        if (plVar12 == (lys_module *)0x0) goto LAB_00130775;
LAB_001306d9:
        plVar13 = lyd_parser_node_schema(plVar19);
        plVar13 = lys_find_child(plVar13,plVar12,local_128,str_len,0,uVar27);
LAB_001306fa:
        snode = plVar13;
        if (plVar13 == (lysc_node *)0x0) {
          ext_00 = &ext;
          LVar6 = ly_nested_ext_schema
                            (plVar19,(lysc_node *)0x0,local_118,local_f0,LY_VALUE_XML,
                             &lydctx->xmlctx->ns,local_128,str_len,&snode,ext_00);
          plVar26 = local_140;
          if (LVar6 == LY_ENOT) {
            if ((lydctx->parse_opts & 0x20000) == 0) goto LAB_0013089a;
            if (plVar19 == (lyd_node *)0x0) {
              plVar2 = lydctx->ext;
              if (plVar2 == (lysc_ext_instance *)0x0) {
                pcVar22 = "Node \"%.*s\" not found in the \"%s\" module.";
                pplVar30 = (lysc_ext_instance **)plVar12->name;
              }
              else {
                pplVar4 = (lysc_ext_instance **)plVar2->def->name;
                if ((lysc_ext_instance **)plVar2->argument == (lysc_ext_instance **)0x0) {
                  pcVar22 = "Node \"%.*s\" not found in the %s extension instance.";
                  pplVar30 = pplVar4;
                }
                else {
                  pcVar22 = "Node \"%.*s\" not found in the \"%s\" %s extension instance.";
                  pplVar30 = (lysc_ext_instance **)plVar2->argument;
                  ext_00 = pplVar4;
                }
              }
              ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,pcVar22,str_len & 0xffffffff,local_128,pplVar30
                      ,ext_00);
            }
            else {
              pplVar24 = &plVar19[1].schema;
              if (plVar19->schema != (lysc_node *)0x0) {
                pplVar24 = (lysc_node **)&plVar19->schema->name;
              }
              ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,
                      "Node \"%.*s\" not found as a child of \"%s\" node.",str_len & 0xffffffff,
                      local_128,*pplVar24);
              plVar26 = local_140;
            }
            goto LAB_00130f54;
          }
        }
        else {
          LVar6 = lyd_parser_check_schema((lyd_ctx *)lydctx,plVar13);
          if (LVar6 == LY_SUCCESS) {
            plVar16 = lydctx->xmlctx;
            LVar6 = LY_SUCCESS;
            hints = 0;
            if (((lydctx->parse_opts >> 0x12 & 1) != 0) && ((plVar13->nodetype & 0x71d) != 0)) {
              if ((plVar16->elements).count == 0) {
                __assert_fail("xmlctx->elements.count",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                              ,0x19b,
                              "LY_ERR lydxml_data_check_opaq(struct lyd_xml_ctx *, const struct lysc_node **)"
                             );
              }
              LVar6 = lyxml_ctx_backup(plVar16,&pxmlctx);
              if (LVar6 == LY_SUCCESS) {
                while (plVar16->status == LYXML_ATTRIBUTE) {
                  LVar6 = lyxml_ctx_next(plVar16);
                  if ((LVar6 != LY_SUCCESS) ||
                     (LVar6 = lyxml_ctx_next(plVar16), LVar6 != LY_SUCCESS)) goto LAB_00131683;
                }
                if ((snode->nodetype & 0xc) == 0) {
                  if (snode->nodetype == 0x10) {
                    LVar6 = lyxml_ctx_next(plVar16);
                    if (LVar6 != LY_SUCCESS) goto LAB_00131683;
                    LVar6 = lydxml_check_list(plVar16,snode);
                    if (LVar6 != LY_SUCCESS) {
                      ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,
                             "Parsing opaque list node \"%s\" with missing/invalid keys.",
                             snode->name);
                      goto LAB_00130a62;
                    }
                  }
                  else {
                    if (plVar16->status != LYXML_ELEM_CONTENT) {
                      __assert_fail("xmlctx->status == LYXML_ELEM_CONTENT",
                                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                                    ,0x1bb,
                                    "LY_ERR lydxml_data_check_opaq(struct lyd_xml_ctx *, const struct lysc_node **)"
                                   );
                    }
                    if ((plVar16->field_5).ws_only == '\0') goto LAB_00130a62;
                  }
LAB_00130a6b:
                  LVar6 = LY_SUCCESS;
                }
                else {
                  opts = ly_temp_log_options(&hints);
                  LVar6 = LY_SUCCESS;
                  LVar8 = ly_value_validate((ly_ctx *)0x0,snode,(plVar16->field_3).prefix,
                                            (plVar16->field_4).prefix_len,LY_VALUE_XML,&plVar16->ns,
                                            0x3f3);
                  plVar19 = local_130;
                  ly_temp_log_options(opts);
                  if (LVar8 != LY_SUCCESS) {
                    ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,
                           "Parsing opaque term node \"%s\" with invalid value \"%.*s\".",
                           snode->name,(ulong)*(uint *)&plVar16->field_4,(plVar16->field_3).prefix);
LAB_00130a62:
                    snode = (lysc_node *)0x0;
                    goto LAB_00130a6b;
                  }
                }
LAB_00131683:
                lyxml_ctx_restore(plVar16,&pxmlctx);
              }
            }
          }
        }
      }
      if (LVar6 == LY_SUCCESS) {
LAB_0013089a:
        plVar13 = snode;
        plVar26 = local_140;
        if (snode == (lysc_node *)0x0) {
          if ((lydctx->parse_opts & 0x40000) == 0) {
            ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Skipping parsing of unknown node \"%.*s\".",
                   str_len & 0xffffffff,local_128);
            LVar6 = lydxml_data_skip(local_120);
            goto LAB_001304e3;
          }
          LVar9 = local_120->status;
          if (LVar9 == LYXML_ATTRIBUTE) {
            LVar6 = lydxml_attrs(local_120,&attr);
            if (LVar6 == LY_SUCCESS) {
              LVar8 = LY_SUCCESS;
            }
            else {
LAB_001316df:
              plVar20 = ly_err_last(lydctx->xmlctx->ctx);
              if ((LVar6 != LY_EVALID) || (LVar6 = LY_EVALID, (lydctx->val_opts & 4) == 0))
              goto LAB_001304e3;
              LVar8 = LY_EVALID;
              LVar6 = LY_EVALID;
              if (plVar20->vecode == LYVE_SYNTAX) goto LAB_001304e3;
            }
            goto LAB_00130cd3;
          }
LAB_00130d8d:
          LVar8 = LY_SUCCESS;
        }
        else {
          LVar9 = local_120->status;
          if (LVar9 != LYXML_ATTRIBUTE) goto LAB_00130d8d;
          local_e0 = lydctx->xmlctx;
          meta = (lyd_meta *)0x0;
          bVar29 = false;
          ly_log_location(snode,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
          iVar7 = strcmp(plVar13->module->name,"notifications");
          local_d8 = plVar13;
          if (iVar7 != 0) {
            plVar2 = plVar13->exts;
            pvVar25 = (void *)0x0;
            plVar23 = plVar2;
            while( true ) {
              if (plVar2 == (lysc_ext_instance *)0x0) {
                pvVar14 = (void *)0x0;
              }
              else {
                pvVar14 = plVar2[-1].compiled;
              }
              bVar29 = pvVar14 <= pvVar25;
              if (bVar29) break;
              plVar3 = plVar23->def;
              iVar7 = strcmp(plVar3->name,"get-filter-element-attributes");
              if ((iVar7 == 0) && (iVar7 = strcmp(plVar3->module->name,"ietf-netconf"), iVar7 == 0))
              break;
              pvVar25 = (void *)((long)pvVar25 + 1);
              plVar23 = plVar23 + 1;
            }
          }
          if (local_e0->status == 3) {
            local_f8 = &local_e0->ns;
            local_c8 = &local_e0->field_6;
            plVar16 = local_e0;
            plVar26 = local_140;
            local_e8 = str_len;
            do {
              if ((plVar16->field_4).prefix_len != 0) {
                plVar11 = lyxml_ns_get(local_f8,(plVar16->field_3).prefix,
                                       (plVar16->field_4).prefix_len);
                if (plVar11 == (lyxml_ns *)0x0) {
                  lydxml_log_namespace_err
                            (plVar16,(plVar16->field_3).prefix,(plVar16->field_4).prefix_len,
                             (plVar16->field_5).name,(plVar16->field_6).name_len);
                }
                else {
                  plVar12 = ly_ctx_get_module_implemented_ns(plVar16->ctx,plVar11->uri);
                  if (plVar12 != (lys_module *)0x0) goto LAB_00130bfe;
                  if ((lydctx->parse_opts & 0x20000) == 0) {
                    LVar6 = lyxml_ctx_next(plVar16);
                    if (LVar6 != LY_SUCCESS) goto LAB_001316b7;
                    if (plVar16->status != LYXML_ATTR_CONTENT) {
                      __assert_fail("xmlctx->status == LYXML_ATTR_CONTENT",
                                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                                    ,0xab,
                                    "LY_ERR lydxml_metadata(struct lyd_xml_ctx *, const struct lysc_node *, struct lyd_meta **)"
                                   );
                    }
                    goto LAB_00130bd0;
                  }
                  pcVar22 = ":";
                  if ((plVar16->field_4).prefix_len == 0) {
                    pcVar22 = "";
                  }
                  ly_vlog(plVar16->ctx,(char *)0x0,LYVE_REFERENCE,
                          "Unknown (or not implemented) YANG module with namespace \"%s\" for metadata \"%.*s%s%.*s\"."
                          ,plVar11->uri,(plVar16->field_4).prefix_len,(plVar16->field_3).prefix,
                          pcVar22,(ulong)*(uint *)&plVar16->field_6,(plVar16->field_5).name);
                }
LAB_001316b1:
                LVar6 = LY_ENOTFOUND;
LAB_001316b7:
                ly_log_location_revert(1,0,0,0);
                lyd_free_meta_siblings(meta);
                meta = (lyd_meta *)0x0;
                goto LAB_001316df;
              }
              if ((!bVar29) &&
                 ((iVar7 = ly_strncmp("type",(plVar16->field_5).name,(plVar16->field_6).name_len),
                  iVar7 == 0 ||
                  (iVar7 = ly_strncmp("select",(plVar16->field_5).name,(plVar16->field_6).name_len),
                  iVar7 == 0)))) {
                plVar12 = ly_ctx_get_module_implemented(plVar16->ctx,"ietf-netconf");
                if (plVar12 == (lys_module *)0x0) {
                  ly_vlog(plVar16->ctx,(char *)0x0,LYVE_REFERENCE,
                          "Missing (or not implemented) YANG module \"ietf-netconf\" for special filter attributes."
                         );
                  goto LAB_001316b1;
                }
LAB_00130bfe:
                pcVar22 = (plVar16->field_5).name;
                sVar17 = (plVar16->field_6).name_len;
                LVar6 = lyxml_ctx_next(plVar16);
                plVar26 = local_140;
                str_len = local_e8;
                if (LVar6 == LY_SUCCESS) {
                  if (plVar16->status != LYXML_ATTR_CONTENT) {
                    __assert_fail("xmlctx->status == LYXML_ATTR_CONTENT",
                                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                                  ,0xb5,
                                  "LY_ERR lydxml_metadata(struct lyd_xml_ctx *, const struct lysc_node *, struct lyd_meta **)"
                                 );
                  }
                  LVar6 = lyd_parser_create_meta
                                    ((lyd_ctx *)lydctx,(lyd_node *)0x0,&meta,plVar12,pcVar22,sVar17,
                                     (plVar16->field_3).prefix,(plVar16->field_4).prefix_len,
                                     &local_c8->dynamic,LY_VALUE_XML,local_f8,0x3f3,local_d8);
                  plVar26 = local_140;
                  str_len = local_e8;
                  if ((LVar6 == LY_SUCCESS) &&
                     (LVar6 = lyxml_ctx_next(plVar16), plVar26 = local_140, str_len = local_e8,
                     LVar6 == LY_SUCCESS)) goto LAB_00130caf;
                }
                goto LAB_001316b7;
              }
              if ((lydctx->parse_opts & 0x20000) != 0) {
                ly_vlog(plVar16->ctx,(char *)0x0,LYVE_REFERENCE,
                        "Missing mandatory prefix for XML metadata \"%.*s\".",
                        (ulong)*(uint *)&plVar16->field_6,(plVar16->field_5).name);
                plVar20 = ly_err_last(lydctx->xmlctx->ctx);
                LVar6 = LY_EVALID;
                if (((lydctx->val_opts & 4) == 0) ||
                   (plVar16 = local_e0, plVar20->vecode == LYVE_SYNTAX)) goto LAB_001316b7;
              }
              LVar6 = lyxml_ctx_next(plVar16);
              if (LVar6 != LY_SUCCESS) goto LAB_001316b7;
              if (plVar16->status != LYXML_ATTR_CONTENT) {
                __assert_fail("xmlctx->status == LYXML_ATTR_CONTENT",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                              ,0x90,
                              "LY_ERR lydxml_metadata(struct lyd_xml_ctx *, const struct lysc_node *, struct lyd_meta **)"
                             );
              }
LAB_00130bd0:
              LVar6 = lyxml_ctx_next(plVar16);
              if (LVar6 != LY_SUCCESS) goto LAB_001316b7;
LAB_00130caf:
            } while (plVar16->status == LYXML_ATTRIBUTE);
          }
          LVar8 = LY_SUCCESS;
          ly_log_location_revert(1,0,0,0);
LAB_00130cd3:
          LVar9 = local_120->status;
          plVar19 = local_130;
        }
        plVar13 = snode;
        if (LVar9 != LYXML_ELEM_CONTENT) {
          __assert_fail("xmlctx->status == LYXML_ELEM_CONTENT",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                        ,0x440,
                        "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                       );
        }
        if (snode == (lysc_node *)0x0) {
          plVar15 = local_b0;
          if (plVar19 == (lyd_node *)0x0) {
LAB_00130e65:
            plVar16 = *(lyxml_ctx **)plVar15;
          }
          else {
            if ((plVar19->schema == (lysc_node *)0x0) || ((plVar19->schema->nodetype & 0x711) != 0))
            {
              plVar15 = plVar19 + 1;
              goto LAB_00130e65;
            }
            plVar16 = (lyxml_ctx *)0x0;
          }
          xmlctx = lydctx->xmlctx;
          pxmlctx.ctx = (ly_ctx *)0x0;
          if ((lydctx->parse_opts & 0x40000) == 0) {
            __assert_fail("lydctx->parse_opts & LYD_PARSE_OPAQ",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                          ,0x29f,
                          "LY_ERR lydxml_subtree_opaq(struct lyd_xml_ctx *, const struct lyd_node *, const char *, uint32_t, const char *, uint32_t, struct lyd_node **, struct lyd_node **)"
                         );
          }
          node = (lyd_node *)0x0;
          local_d8 = (lysc_node *)(xmlctx->field_3).prefix;
          value_len = (anon_union_8_2_93990481_for_lyxml_ctx_9 *)(xmlctx->field_4).prefix_len;
          local_f8 = (ly_set *)
                     CONCAT44(local_f8._4_4_,
                              (int)CONCAT71((int7)((ulong)plVar16 >> 8),(xmlctx->field_6).dynamic));
          if ((xmlctx->field_6).dynamic != '\0') {
            (xmlctx->field_6).dynamic = '\0';
          }
          local_e8 = CONCAT71(local_e8._1_7_,(xmlctx->field_5).ws_only);
          local_e0 = plVar16;
          LVar6 = ly_store_prefix_data
                            (xmlctx->ctx,local_d8,(size_t)value_len,LY_VALUE_XML,&xmlctx->ns,
                             &local_cc,&pxmlctx.ctx);
          if (LVar6 == LY_SUCCESS) {
            prefix_len = local_f0 & 0xffffffff;
            local_c8 = value_len;
            plVar11 = lyxml_ns_get(&xmlctx->ns,local_118,prefix_len);
            if (plVar11 == (lyxml_ns *)0x0) {
              pcVar22 = (char *)0x0;
            }
            else {
              pcVar22 = plVar11->uri;
            }
            lydxml_get_hints_opaq
                      (local_128,str_len & 0xffffffff,(xmlctx->field_3).prefix,
                       (xmlctx->field_4).prefix_len,(lyd_node *)local_e0,pcVar22,&hints,
                       &insert_anchor);
            plVar26 = xmlctx->ctx;
            if (pcVar22 == (char *)0x0) {
              sVar17 = 0;
            }
            else {
              sVar17 = strlen(pcVar22);
            }
            cVar28 = (char)local_f8;
            LVar6 = lyd_create_opaq(plVar26,local_128,str_len & 0xffffffff,local_118,prefix_len,
                                    pcVar22,sVar17,(char *)0x0,0,(ly_bool *)0x0,local_cc,(void *)0x0
                                    ,hints,&node);
            if (LVar6 == LY_SUCCESS) {
              if (node == (lyd_node *)0x0) {
                __assert_fail("*node",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                              ,700,
                              "LY_ERR lydxml_subtree_opaq(struct lyd_xml_ctx *, const struct lyd_node *, const char *, uint32_t, const char *, uint32_t, struct lyd_node **, struct lyd_node **)"
                             );
              }
              ly_log_location((lysc_node *)0x0,node,(char *)0x0,(ly_in *)0x0);
              LVar6 = lyxml_ctx_next(xmlctx);
              while (plVar19 = node, LVar6 == LY_SUCCESS) {
                if (xmlctx->status != LYXML_ELEMENT) {
                  lVar5._0_4_ = node[1].hash;
                  lVar5._4_4_ = node[1].flags;
                  if (lVar5 == 0) {
                    if (local_c8 != (anon_union_8_2_93990481_for_lyxml_ctx_9 *)0x0) {
                      plVar15 = node + 1;
                      lydict_remove(xmlctx->ctx,(char *)node[1].prev);
                      if (cVar28 == '\0') {
                        LVar6 = lydict_insert(xmlctx->ctx,(char *)local_d8,(size_t)local_c8,
                                              (char **)&plVar15->prev);
                        if (LVar6 != LY_SUCCESS) {
                          cVar28 = '\0';
                          break;
                        }
                        cVar28 = '\0';
                      }
                      else {
                        LVar6 = lydict_insert_zc(xmlctx->ctx,(char *)local_d8,
                                                 (char **)&plVar15->prev);
                        if (LVar6 != LY_SUCCESS) {
                          cVar28 = '\x01';
                          break;
                        }
                        cVar28 = '\0';
                      }
                    }
                  }
                  else if ((char)local_e8 == '\0') {
                    pplVar24 = &node[1].schema;
                    if (node->schema != (lysc_node *)0x0) {
                      pplVar24 = (lysc_node **)&node->schema->name;
                    }
                    LVar6 = LY_EVALID;
                    ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX_XML,
                            "Mixed XML content node \"%s\" found, not supported.",*pplVar24);
                    break;
                  }
                  if (plVar19[1].priv != (void *)0x0) {
                    __assert_fail("!opaq->val_prefix_data",
                                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                                  ,0x2dc,
                                  "LY_ERR lydxml_subtree_opaq(struct lyd_xml_ctx *, const struct lyd_node *, const char *, uint32_t, const char *, uint32_t, struct lyd_node **, struct lyd_node **)"
                                 );
                  }
                  plVar19[1].priv = pxmlctx.ctx;
                  pxmlctx.ctx = (ly_ctx *)0x0;
                  LVar6 = LY_SUCCESS;
                  break;
                }
                first_p_00 = lyd_node_child_p(node);
                LVar6 = lydxml_subtree_r(lydctx,plVar19,first_p_00,(ly_set *)0x0);
              }
            }
          }
          else {
            cVar28 = (char)local_f8;
          }
          plVar26 = local_140;
          if (node != (lyd_node *)0x0) {
            ly_log_location_revert(0,1,0,0);
          }
          ly_free_prefix_data(local_cc,pxmlctx.ctx);
          if (cVar28 != '\0') {
            free(local_d8);
          }
          if (LVar6 != LY_SUCCESS) {
            lyd_free_tree(node);
            node = (lyd_node *)0x0;
          }
LAB_001312ae:
          if (LVar6 == LY_SUCCESS) goto LAB_001312ed;
        }
        else {
          uVar1 = snode->nodetype;
          if ((uVar1 & 0xc) == 0) {
            if ((uVar1 & 0x711) == 0) {
              if ((uVar1 & 0x60) == 0) {
                __assert_fail("snode->nodetype & LYD_NODE_ANY",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                              ,0x44d,
                              "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                             );
              }
              LVar6 = lydxml_subtree_any(lydctx,snode,ext,&node);
              plVar26 = local_140;
            }
            else {
              LVar6 = lydxml_subtree_inner(lydctx,snode,ext,&node);
              plVar26 = local_140;
            }
            goto LAB_001312ae;
          }
          plVar16 = lydctx->xmlctx;
          node = (lyd_node *)0x0;
          LVar10 = lyd_parser_create_term
                             ((lyd_ctx *)lydctx,snode,(plVar16->field_3).prefix,
                              (plVar16->field_4).prefix_len,&(plVar16->field_6).dynamic,LY_VALUE_XML
                              ,&plVar16->ns,0x3f3,&node);
          if (LVar10 == LY_SUCCESS) {
            LVar6 = LY_SUCCESS;
LAB_00130f82:
            if (((node != (lyd_node *)0x0) &&
                (bVar29 = local_130 != (lyd_node *)0x0,
                ly_log_location((lysc_node *)0x0,node,(char *)0x0,(ly_in *)0x0),
                node != (lyd_node *)0x0 && bVar29)) && ((plVar13->flags & 0x100) != 0)) {
              if ((local_130->schema == (lysc_node *)0x0) ||
                 ((local_130->schema->nodetype & 0x711) != 0)) {
                plVar19 = *(lyd_node **)(local_130 + 1);
              }
              else {
                plVar19 = (lyd_node *)0x0;
              }
              plVar19 = lyd_insert_get_next_anchor(plVar19,node);
              if (((plVar19 != (lyd_node *)0x0) && (plVar19->schema != (lysc_node *)0x0)) &&
                 ((plVar19->schema->flags & 0x100) != 0)) {
                if ((lydctx->parse_opts & 0x20000) == 0) {
                  ly_log(plVar16->ctx,LY_LLWRN,LY_SUCCESS,
                         "Invalid position of the key \"%s\" in a list.");
                }
                else {
                  ly_vlog(plVar16->ctx,(char *)0x0,LYVE_DATA,
                          "Invalid position of the key \"%s\" in a list.",plVar13->name);
                  plVar20 = ly_err_last(lydctx->xmlctx->ctx);
                  LVar10 = LY_EVALID;
                  if (((lydctx->val_opts & 4) == 0) ||
                     (LVar6 = LVar10, plVar20->vecode == LYVE_SYNTAX)) goto LAB_00131138;
                }
              }
            }
            LVar10 = lyxml_ctx_next(plVar16);
            if ((LVar10 == LY_SUCCESS) && (LVar10 = LVar6, plVar16->status == LYXML_ELEMENT)) {
              ly_vlog(plVar16->ctx,(char *)0x0,LYVE_SYNTAX,
                      "Child element \"%.*s\" inside a terminal node \"%s\" found.",
                      (ulong)*(uint *)&plVar16->field_6,(plVar16->field_5).name,plVar13->name);
              ly_err_last(lydctx->xmlctx->ctx);
              LVar10 = LY_EVALID;
            }
          }
          else {
            plVar20 = ly_err_last(lydctx->xmlctx->ctx);
            if (((LVar10 == LY_EVALID) && (LVar10 = LY_EVALID, (lydctx->val_opts & 4) != 0)) &&
               (LVar6 = LVar10, plVar20->vecode != LYVE_SYNTAX)) goto LAB_00130f82;
          }
LAB_00131138:
          if (node != (lyd_node *)0x0) {
            ly_log_location_revert(0,1,0,0);
          }
          plVar26 = local_140;
          if (LVar10 == LY_SUCCESS) goto LAB_001312ed;
          if ((LVar10 != LY_EVALID) || (LVar6 = LY_EVALID, (lydctx->val_opts & 4) == 0)) {
            lyd_free_tree(node);
            node = (lyd_node *)0x0;
            LVar6 = LVar10;
          }
        }
        plVar20 = ly_err_last(lydctx->xmlctx->ctx);
        if ((LVar6 != LY_EVALID) || (LVar6 = LY_EVALID, (lydctx->val_opts & 4) == 0))
        goto LAB_001304e3;
        LVar8 = LY_EVALID;
        LVar6 = LY_EVALID;
        if (plVar20->vecode == LYVE_SYNTAX) goto LAB_001304e3;
        goto LAB_001312ed;
      }
      plVar26 = local_140;
      if (LVar6 != LY_EVALID) goto LAB_001304e3;
    }
LAB_00130f54:
    LVar6 = LY_EVALID;
    if ((lydctx->val_opts & 4) != 0) {
      LVar8 = lydxml_data_skip(local_120);
      LVar6 = LY_EVALID;
      if (LVar8 != LY_SUCCESS) {
        LVar6 = LVar8;
      }
    }
    goto LAB_001304e3;
  }
  iVar7 = ly_strncmp("eventTime",str,str_len);
  plVar26 = local_140;
  if (iVar7 != 0) {
    uVar27 = lydctx->int_opts;
    goto LAB_00130580;
  }
  if (local_120->status != LYXML_ELEM_CONTENT) {
    __assert_fail("xmlctx->status == LYXML_ELEM_CONTENT",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x40b,
                  "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                 );
  }
  if ((local_120->field_5).ws_only == '\0') {
    sVar17 = (local_120->field_4).prefix_len;
  }
  else {
    sVar17 = 0;
  }
  LVar6 = lyd_create_opaq(local_120->ctx,str,str_len,local_118,0,
                          "urn:ietf:params:xml:ns:netconf:notification:1.0",0x2f,
                          (local_120->field_3).prefix,sVar17,(ly_bool *)0x0,LY_VALUE_XML,(void *)0x0
                          ,0x3f3,&node);
  if (LVar6 != LY_SUCCESS) goto LAB_001304e3;
  LVar6 = lyd_parser_notif_eventtime_validate(node);
  plVar16 = local_120;
  if ((LVar6 != LY_SUCCESS) || (LVar6 = lyxml_ctx_next(local_120), LVar6 != LY_SUCCESS)) {
    lyd_free_tree(node);
    goto LAB_001304e3;
  }
  LVar8 = LY_SUCCESS;
  if (plVar16->status != LYXML_ELEM_CLOSE) {
    ly_vlog(plVar26,(char *)0x0,LYVE_DATA,"Unexpected notification \"eventTime\" node children.");
    lyd_free_tree(node);
    LVar6 = LY_EVALID;
    goto LAB_001304e3;
  }
LAB_001312ed:
  if ((node == (lyd_node *)0x0) || (snode == (lysc_node *)0x0)) {
LAB_00131372:
    set = local_a0;
    if (local_120->status != LYXML_ELEM_CLOSE) {
      __assert_fail("xmlctx->status == LYXML_ELEM_CLOSE",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                    ,0x460,
                    "LY_ERR lydxml_subtree_r(struct lyd_xml_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                   );
    }
    if (((local_b8 >> 0x16 & 1) != 0) || (LVar6 = lyxml_ctx_next(local_120), LVar6 == LY_SUCCESS)) {
      plVar19 = local_b0;
      LVar6 = LVar8;
      if (node == (lyd_node *)0x0) goto LAB_001304e3;
      if (snode == (lysc_node *)0x0) {
        lyd_insert_attr(node,attr);
        attr = (lyd_attr *)0x0;
      }
      else {
        lyd_insert_meta(node,meta,'\0');
        meta = (lyd_meta *)0x0;
      }
      if (insert_anchor == (lyd_node *)0x0) {
        if (ext == (lysc_ext_instance *)0x0) {
          lyd_insert_node(local_130,(lyd_node **)plVar19,node,lydctx->parse_opts >> 0x15 & 1);
        }
        else {
          LVar6 = lyplg_ext_insert(local_130,node);
          if (LVar6 != LY_SUCCESS) goto LAB_001313a4;
        }
      }
      else {
        lyd_insert_after(insert_anchor,node);
      }
      if (local_130 == (lyd_node *)0x0) {
        lVar18._0_4_ = plVar19->hash;
        lVar18._4_4_ = plVar19->flags;
        while (lVar18 = *(long *)(lVar18 + 0x20), *(long *)(lVar18 + 0x18) != 0) {
          plVar19->hash = (int)lVar18;
          plVar19->flags = (int)((ulong)lVar18 >> 0x20);
        }
      }
      LVar6 = LVar8;
      if (set != (ly_set *)0x0) {
        ly_set_add(set,node,'\x01',(uint32_t *)0x0);
      }
      goto LAB_001304e3;
    }
  }
  else {
    LVar6 = lyd_parser_set_data_flags(node,&meta,(lyd_ctx *)lydctx,ext);
    if (LVar6 == LY_SUCCESS) {
      if (((lydctx->parse_opts & 0x10000) == 0) &&
         (LVar6 = lyd_validate_node_ext(node,&lydctx->ext_node), LVar6 != LY_SUCCESS)) {
        plVar20 = ly_err_last(lydctx->xmlctx->ctx);
        if ((LVar6 != LY_EVALID) || (LVar6 = LY_EVALID, (lydctx->val_opts & 4) == 0))
        goto LAB_001304e3;
        LVar8 = LY_EVALID;
        LVar6 = LY_EVALID;
        if (plVar20->vecode == LYVE_SYNTAX) goto LAB_001304e3;
      }
      goto LAB_00131372;
    }
  }
LAB_001313a4:
  lyd_free_tree(node);
LAB_001304e3:
  lydctx->parse_opts = local_b4;
  lyd_free_meta_siblings(meta);
  lyd_free_attr_siblings(plVar26,attr);
  return LVar6;
}

Assistant:

static LY_ERR
lydxml_subtree_r(struct lyd_xml_ctx *lydctx, struct lyd_node *parent, struct lyd_node **first_p, struct ly_set *parsed)
{
    LY_ERR r, rc = LY_SUCCESS;
    const char *prefix, *name;
    size_t prefix_len, name_len;
    struct lyxml_ctx *xmlctx;
    const struct ly_ctx *ctx;
    struct lyd_meta *meta = NULL;
    struct lyd_attr *attr = NULL;
    const struct lysc_node *snode = NULL;
    struct lysc_ext_instance *ext = NULL;
    uint32_t orig_parse_opts;
    struct lyd_node *node = NULL, *insert_anchor = NULL;
    ly_bool parse_subtree;

    assert(parent || first_p);

    xmlctx = lydctx->xmlctx;
    ctx = xmlctx->ctx;

    parse_subtree = lydctx->parse_opts & LYD_PARSE_SUBTREE ? 1 : 0;
    /* all descendants should be parsed */
    lydctx->parse_opts &= ~LYD_PARSE_SUBTREE;
    orig_parse_opts = lydctx->parse_opts;

    assert(xmlctx->status == LYXML_ELEMENT);

    /* remember element prefix and name */
    prefix = xmlctx->prefix;
    prefix_len = xmlctx->prefix_len;
    name = xmlctx->name;
    name_len = xmlctx->name_len;

    /* parser next */
    rc = lyxml_ctx_next(xmlctx);
    LY_CHECK_GOTO(rc, cleanup);

    if ((lydctx->int_opts & LYD_INTOPT_EVENTTIME) && !parent && name_len && !prefix_len &&
            !ly_strncmp("eventTime", name, name_len)) {
        /* parse eventTime, create node */
        assert(xmlctx->status == LYXML_ELEM_CONTENT);
        rc = lyd_create_opaq(xmlctx->ctx, name, name_len, prefix, prefix_len,
                "urn:ietf:params:xml:ns:netconf:notification:1.0", 47, xmlctx->value,
                xmlctx->ws_only ? 0 : xmlctx->value_len, NULL, LY_VALUE_XML, NULL, LYD_HINT_DATA, &node);
        LY_CHECK_GOTO(rc, cleanup);

        /* validate the value */
        r = lyd_parser_notif_eventtime_validate(node);
        LY_CHECK_ERR_GOTO(r, rc = r; lyd_free_tree(node), cleanup);

        /* parser next */
        r = lyxml_ctx_next(xmlctx);
        LY_CHECK_ERR_GOTO(r, rc = r; lyd_free_tree(node), cleanup);
        if (xmlctx->status != LYXML_ELEM_CLOSE) {
            LOGVAL(ctx, LYVE_DATA, "Unexpected notification \"eventTime\" node children.");
            rc = LY_EVALID;
            lyd_free_tree(node);
            goto cleanup;
        }

        goto node_parsed;
    }

    /* get the schema node */
    r = lydxml_subtree_get_snode(lydctx, parent, prefix, prefix_len, name, name_len, &snode, &ext);
    if (r) {
        rc = r;
        if ((r == LY_EVALID) && (lydctx->val_opts & LYD_VALIDATE_MULTI_ERROR)) {
            /* skip the invalid data */
            if ((r = lydxml_data_skip(xmlctx))) {
                rc = r;
            }
        }
        goto cleanup;
    } else if (!snode && !(lydctx->parse_opts & LYD_PARSE_OPAQ)) {
        LOGVRB("Skipping parsing of unknown node \"%.*s\".", (int)name_len, name);

        /* skip element with children */
        rc = lydxml_data_skip(xmlctx);
        goto cleanup;
    }

    /* create metadata/attributes */
    if (xmlctx->status == LYXML_ATTRIBUTE) {
        if (snode) {
            r = lydxml_metadata(lydctx, snode, &meta);
        } else {
            assert(lydctx->parse_opts & LYD_PARSE_OPAQ);
            r = lydxml_attrs(xmlctx, &attr);
        }
    }
    LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);

    assert(xmlctx->status == LYXML_ELEM_CONTENT);
    if (!snode) {
        /* opaque */
        r = lydxml_subtree_opaq(lydctx, parent ? lyd_child(parent) : *first_p, prefix, prefix_len, name, name_len,
                &insert_anchor, &node);
    } else if (snode->nodetype & LYD_NODE_TERM) {
        /* term */
        r = lydxml_subtree_term(lydctx, parent, snode, &node);
    } else if (snode->nodetype & LYD_NODE_INNER) {
        /* inner */
        r = lydxml_subtree_inner(lydctx, snode, ext, &node);
    } else {
        /* any */
        assert(snode->nodetype & LYD_NODE_ANY);
        r = lydxml_subtree_any(lydctx, snode, ext, &node);
    }
    LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);

node_parsed:
    if (node && snode) {
        /* add/correct flags */
        r = lyd_parser_set_data_flags(node, &meta, (struct lyd_ctx *)lydctx, ext);
        LY_CHECK_ERR_GOTO(r, rc = r; lyd_free_tree(node), cleanup);

        if (!(lydctx->parse_opts & LYD_PARSE_ONLY)) {
            /* store for ext instance node validation, if needed */
            r = lyd_validate_node_ext(node, &lydctx->ext_node);
            LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
        }
    }

    /* parser next */
    assert(xmlctx->status == LYXML_ELEM_CLOSE);
    if (!parse_subtree) {
        r = lyxml_ctx_next(xmlctx);
        LY_CHECK_ERR_GOTO(r, rc = r; lyd_free_tree(node), cleanup);
    }

    LY_CHECK_GOTO(!node, cleanup);

    /* add metadata/attributes */
    if (snode) {
        lyd_insert_meta(node, meta, 0);
        meta = NULL;
    } else {
        lyd_insert_attr(node, attr);
        attr = NULL;
    }

    /* insert, keep first pointer correct */
    if (insert_anchor) {
        lyd_insert_after(insert_anchor, node);
    } else if (ext) {
        r = lyplg_ext_insert(parent, node);
        LY_CHECK_ERR_GOTO(r, rc = r; lyd_free_tree(node), cleanup);
    } else {
        lyd_insert_node(parent, first_p, node,
                lydctx->parse_opts & LYD_PARSE_ORDERED ? LYD_INSERT_NODE_LAST : LYD_INSERT_NODE_DEFAULT);
    }
    while (!parent && (*first_p)->prev->next) {
        *first_p = (*first_p)->prev;
    }

    /* rememeber a successfully parsed node */
    if (parsed) {
        ly_set_add(parsed, node, 1, NULL);
    }

cleanup:
    lydctx->parse_opts = orig_parse_opts;
    lyd_free_meta_siblings(meta);
    lyd_free_attr_siblings(ctx, attr);
    return rc;
}